

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

bool __thiscall Inferences::ActiveOccurrenceIterator::hasNext(ActiveOccurrenceIterator *this)

{
  Term **ppTVar1;
  Term **ppTVar2;
  Term **ppTVar3;
  Term *this_00;
  Term *elem;
  bool bVar4;
  const_reference cVar5;
  uint uVar6;
  InductionTemplate *pIVar7;
  ulong __n;
  int iVar8;
  
  do {
    ppTVar1 = (this->_returnStack)._stack;
    ppTVar2 = (this->_returnStack)._cursor;
    if ((ppTVar2 != ppTVar1) ||
       (ppTVar3 = (this->_processStack)._cursor, ppTVar3 == (this->_processStack)._stack)) {
      return ppTVar2 != ppTVar1;
    }
    (this->_processStack)._cursor = ppTVar3 + -1;
    this_00 = ppTVar3[-1];
    bVar4 = Kernel::Term::ground(this_00);
    if (bVar4) {
      Lib::Stack<Kernel::Term_*>::push(&this->_returnStack,this_00);
    }
    pIVar7 = Shell::FunctionDefinitionHandler::getInductionTemplate(this->_fnDefHandler,this_00);
    uVar6 = Kernel::Term::numTypeArguments(this_00);
    iVar8 = -uVar6;
    for (__n = (ulong)uVar6; uVar6 = *(uint *)&this_00->field_0xc & 0xfffffff, __n < uVar6;
        __n = __n + 1) {
      if (pIVar7 == (InductionTemplate *)0x0) {
LAB_003f3ceb:
        elem = (Term *)this_00->_args[(int)(uVar6 + iVar8)]._content;
        if (((ulong)elem & 3) == 0) {
          Lib::Stack<Kernel::Term_*>::push(&this->_processStack,elem);
        }
      }
      else {
        cVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&pIVar7->_indPos,__n);
        if (cVar5) {
          uVar6 = *(uint *)&this_00->field_0xc & 0xfffffff;
          goto LAB_003f3ceb;
        }
      }
      iVar8 = iVar8 + -1;
    }
  } while( true );
}

Assistant:

bool ActiveOccurrenceIterator::hasNext() {
  while (_returnStack.isEmpty() && !_processStack.isEmpty()) {
    Term* t = _processStack.pop();
    if (t->ground()) {
      _returnStack.push(t);
    }
    InductionTemplate* templ = _fnDefHandler.getInductionTemplate(t);
    const vector<bool>* actPos = templ ? &templ->inductionPositions() : nullptr;
    for (unsigned i = t->numTypeArguments(); i < t->arity(); i++) {
      if ((!actPos || (*actPos)[i]) && t->nthArgument(i)->isTerm()) {
        _processStack.push(t->nthArgument(i)->term());
      }
    }
  }
  return !_returnStack.isEmpty();
}